

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::TestSpec::Pattern::~Pattern(Pattern *this)

{
  Pattern *this_local;
  
  this->_vptr_Pattern = (_func_int **)&PTR__Pattern_0024c6d0;
  std::__cxx11::string::~string((string *)&this->m_name);
  return;
}

Assistant:

TestSpec::Pattern::~Pattern() = default;